

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_fee.cpp
# Opt level: O1

Amount cfd::FeeCalculator::CalculateFee(uint32_t size,uint32_t vsize,uint64_t rate)

{
  ulong uVar1;
  ulong uVar2;
  Amount AVar3;
  
  uVar1 = (ulong)size;
  if (vsize != 0) {
    uVar1 = (ulong)vsize;
  }
  uVar2 = (uVar1 * rate) / 1000;
  uVar1 = 1000;
  if (1000 < uVar2) {
    uVar1 = uVar2;
  }
  AVar3 = core::Amount::CreateBySatoshiAmount(uVar1);
  return AVar3;
}

Assistant:

Amount FeeCalculator::CalculateFee(  // Fee計算
    uint32_t size, uint32_t vsize, uint64_t rate) {
  int64_t satoshi;
  uint32_t use_size = ((vsize != 0) && (size != vsize)) ? vsize : size;
  satoshi = use_size * rate / kKiloByteSize;
  if (satoshi < kRelayMinimumFee) {
    satoshi = kRelayMinimumFee;
  }
  return Amount::CreateBySatoshiAmount(satoshi);
}